

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

ArrayPtr<const_capnp::_::RawSchema_*> __thiscall
kj::Arena::allocateArray<capnp::_::RawSchema_const*>(Arena *this,size_t size)

{
  ArrayPtr<const_capnp::_::RawSchema_*> AVar1;
  
  AVar1.ptr = (RawSchema **)allocateBytes(this,size * 8,8,false);
  AVar1.size_ = size;
  return AVar1;
}

Assistant:

ArrayPtr<T> Arena::allocateArray(size_t size) {
  if (KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
    ArrayPtr<T> result =
        arrayPtr(reinterpret_cast<T*>(allocateBytes(
            sizeof(T) * size, alignof(T), false)), size);
    if (!KJ_HAS_TRIVIAL_CONSTRUCTOR(T)) {
      for (size_t i = 0; i < size; i++) {
        ctor(result[i]);
      }
    }
    return result;
  } else {
    // Allocate with a 64-bit prefix in which we store the array size.
    constexpr size_t prefixSize = kj::max(alignof(T), sizeof(size_t));
    void* base = allocateBytes(sizeof(T) * size + prefixSize, alignof(T), true);
    size_t& tag = *reinterpret_cast<size_t*>(base);
    ArrayPtr<T> result =
        arrayPtr(reinterpret_cast<T*>(reinterpret_cast<byte*>(base) + prefixSize), size);
    setDestructor(base, &destroyArray<T>);

    if (KJ_HAS_TRIVIAL_CONSTRUCTOR(T)) {
      tag = size;
    } else {
      // In case of constructor exceptions, we need the tag to end up storing the number of objects
      // that were successfully constructed, so that they'll be properly destroyed.
      tag = 0;
      for (size_t i = 0; i < size; i++) {
        ctor(result[i]);
        tag = i + 1;
      }
    }
    return result;
  }
}